

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BOV.c
# Opt level: O1

bov_points_t *
bov_points_partial_update
          (bov_points_t *points,GLfloat (*coords) [2],GLint start,GLsizei count,GLsizei newN)

{
  int iVar1;
  
  if (coords == (GLfloat (*) [2])0x0) {
    bov_points_partial_update_cold_2();
  }
  else {
    if (newN == 0) {
      newN = points->vboLen;
    }
    if (newN < count + start) {
      newN = count + start;
    }
    iVar1 = 0x7fffffff;
    if (-1 < start) {
      iVar1 = newN;
    }
    if (iVar1 <= points->vboCapacity) {
      points->vboLen = iVar1;
      if (count == 0) {
        return points;
      }
      (*glad_glBindBuffer)(0x8892,points->vbo);
      (*glad_glBufferSubData)(0x8892,(long)start,(long)count << 3,coords);
      return points;
    }
    bov_points_partial_update_cold_1();
  }
  return (bov_points_t *)0x0;
}

Assistant:

bov_points_t* bov_points_partial_update(bov_points_t* points,
                                        const GLfloat coords[][2],
                                        GLint start,
                                        GLsizei count,
                                        GLsizei newN)
{
	if(coords==NULL) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update with a NULL "
		              "pointer as array of coordinates");
		return NULL;
	}

	if(newN==0)
		newN = points->vboLen;

	if(start + count > newN)
		newN = start + count;
	if(start + count < count) // detect overflow
		newN = BOV_TILL_END;

	if(newN > points->vboCapacity) {
		BOV_ERROR_LOG(BOV_PARAMETER_ERROR,
		              "Cannot do a partial update when the new "
		              "size is bigger than the capacity of the "
		              "buffer");
		return NULL;
	}

	points->vboLen = newN;

	if(count==0)
		return points;

	glBindBuffer(GL_ARRAY_BUFFER, points->vbo);
	glBufferSubData(GL_ARRAY_BUFFER,
	                start,
	                sizeof(GLfloat) * 2 * count,
	                coords);
	// glBindBuffer(GL_ARRAY_BUFFER, 0);

	return points;
}